

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O1

void __thiscall
burst::detail::
join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
::join_iterator_impl
          (join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
           *this,outer_range_iterator first,outer_range_iterator last)

{
  int *piVar1;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar2;
  uint uVar3;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar4;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar5;
  outer_range_iterator oVar6;
  
  (this->m_begin)._M_current = first._M_current;
  (this->m_end)._M_current = last._M_current;
  piVar4 = (iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            *)0x0;
  oVar6._M_current = first._M_current;
  if (first._M_current == last._M_current) {
    oVar6._M_current = piVar4;
  }
  (this->m_outer)._M_current = oVar6._M_current;
  if (first._M_current != last._M_current) {
    piVar4 = (iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)(((this->m_outer)._M_current)->
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                ).
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                .m_Begin._M_current;
  }
  (this->m_inner)._M_current = (int *)piVar4;
  this->m_items_remaining = 0;
  if (first._M_current != last._M_current) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (int)((ulong)((long)((first._M_current)->
                                          super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                                          ).
                                          super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                                          .
                                          super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                                          .m_End._M_current -
                                   (long)((first._M_current)->
                                         super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                                         ).
                                         super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                                         .
                                         super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                                         .m_Begin._M_current) >> 2);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
    this->m_items_remaining = (ulong)uVar3;
    piVar4 = (this->m_outer)._M_current;
    if ((this->m_inner)._M_current ==
        (piVar4->
        super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
        ).
        super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_current) {
      do {
        piVar5 = piVar4 + 1;
        (this->m_outer)._M_current = piVar5;
        if (piVar5 == last._M_current) {
          return;
        }
        piVar1 = (piVar5->
                 super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin._M_current;
        (this->m_inner)._M_current = piVar1;
        piVar2 = piVar4 + 1;
        piVar4 = piVar5;
      } while (piVar1 == (piVar2->
                         super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                         ).
                         super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                         .
                         super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                         .m_End._M_current);
    }
  }
  return;
}

Assistant:

explicit join_iterator_impl (outer_range_iterator first, outer_range_iterator last):
                m_begin(std::move(first)),
                m_end(std::move(last)),
                m_outer(m_begin != m_end ? m_begin : outer_range_iterator{}),
                m_inner(m_begin != m_end ? m_outer->begin() : inner_range_iterator{}),
                m_items_remaining{}
            {
                if (m_begin != m_end)
                {
                    m_items_remaining =
                        std::accumulate(m_begin, m_end, 0u,
                            [] (auto v, const auto & r)
                            {
                                return v + r.size();
                            });

                    maintain_invariant();
                }
            }